

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool instMatchesCrit(Instruction *I,string *fun,uint line,string *obj,LLVMPointerAnalysis *pta)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  BasicBlock *this;
  ulong uVar4;
  char *pcVar5;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this_00;
  string *in_RCX;
  int in_EDX;
  Instruction *in_RDI;
  byte bVar6;
  undefined1 auVar7 [16];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool isfunc;
  size_type len;
  bool isglobal;
  string objname;
  bool isvar;
  DebugLoc *Loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined2 in_stack_fffffffffffffec8;
  byte bVar9;
  undefined1 uVar10;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffed9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffee9;
  string local_110 [39];
  byte local_e9;
  ulong local_e8;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [32];
  string local_98 [8];
  LLVMPointerAnalysis *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7f;
  string *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  byte bVar11;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  string local_50 [40];
  string *local_28;
  int local_1c;
  Instruction *local_10;
  byte local_1;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  auVar7._8_8_ = in_stack_ffffffffffffffa8;
  auVar7._0_8_ = in_stack_ffffffffffffffa0;
  bVar11 = 0;
  bVar9 = false;
  if ((uVar2 & 1) == 0) {
    this = llvm::Instruction::getParent(local_10);
    llvm::BasicBlock::getParent(this);
    auVar7 = llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_
              ((StringRef *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8));
    bVar11 = 1;
    bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8);
  }
  uVar10 = bVar9;
  if ((bVar11 & 1) != 0) {
    std::__cxx11::string::~string(local_50);
  }
  if ((bVar9 & 1) == 0) {
    if (local_1c != 0) {
      llvm::Instruction::getDebugLoc(local_10);
      bVar1 = llvm::DebugLoc::operator_cast_to_bool((DebugLoc *)0x1e0b27);
      if ((!bVar1) || (iVar3 = llvm::DebugLoc::getLine(), local_1c != iVar3)) {
        local_1 = 0;
        goto LAB_001e0e98;
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_28);
      bVar6 = *pcVar5 == '&';
      std::__cxx11::string::string(local_98);
      if ((bVar6 & 1) == 0) {
        std::__cxx11::string::operator=(local_98,local_28);
      }
      else {
        std::__cxx11::string::substr((ulong)local_b8,(ulong)local_28);
        std::__cxx11::string::operator=(local_98,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_98);
      local_b9 = *pcVar5 == '@';
      if ((bool)local_b9) {
        std::__cxx11::string::substr((ulong)local_e0,(ulong)local_28);
        std::__cxx11::string::operator=(local_98,local_e0);
        std::__cxx11::string::~string(local_e0);
      }
      local_e8 = std::__cxx11::string::length();
      local_e9 = false;
      if (2 < local_e8) {
        iVar3 = std::__cxx11::string::compare((ulong)local_98,local_e8 - 2,(char *)0x2);
        local_e9 = iVar3 == 0;
      }
      if ((bool)local_e9 != false) {
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_98);
        std::__cxx11::string::operator=(local_98,local_110);
        std::__cxx11::string::~string(local_110);
      }
      if (((bVar6 & 1) == 0) || ((local_e9 & 1) == 0)) {
        if (((bVar6 & 1) == 0) &&
           (bVar1 = instIsCallOf(auVar7._8_8_,auVar7._0_8_,
                                 (LLVMPointerAnalysis *)CONCAT17(bVar11,in_stack_ffffffffffffff98)),
           bVar1)) {
          local_1 = 1;
        }
        else if (((local_e9 & 1) == 0) &&
                (bVar1 = usesTheVariable((Instruction *)CONCAT17(bVar6,in_stack_ffffffffffffff88),
                                         in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f,
                                         in_stack_ffffffffffffff70), bVar1)) {
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
      }
      else {
        if ((instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
             ::reported_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                                         ::reported_abi_cxx11_), iVar3 != 0)) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1e0d50);
          __cxa_atexit(std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::~set,&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                               ::reported_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                               ::reported_abi_cxx11_);
        }
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(in_stack_fffffffffffffee0,
                         (value_type *)CONCAT71(in_stack_fffffffffffffed9,in_stack_fffffffffffffed8)
                        );
        this_00 = pVar8.first._M_node;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          llvm::errs();
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)this_00._M_node,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,
                                      CONCAT13(uVar10,CONCAT12(bVar9,in_stack_fffffffffffffec8))));
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)this_00._M_node,
                     (string *)
                     CONCAT44(in_stack_fffffffffffffecc,
                              CONCAT13(uVar10,CONCAT12(bVar9,in_stack_fffffffffffffec8))));
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)this_00._M_node,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,
                                      CONCAT13(uVar10,CONCAT12(bVar9,in_stack_fffffffffffffec8))));
        }
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_98);
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001e0e98:
  return (bool)(local_1 & 1);
}

Assistant:

static bool instMatchesCrit(const llvm::Instruction &I, const std::string &fun,
                            unsigned line, const std::string &obj,
                            LLVMPointerAnalysis *pta = nullptr) {
    // function match?
    if (!fun.empty() && I.getParent()->getParent()->getName().str() != fun)
        return false;

    // line match?
    if (line > 0) {
        const auto &Loc = I.getDebugLoc();
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        if (Loc.getLine() != line)
#else
        if (!Loc || line != Loc.getLine())
#endif
        {
            return false;
        }
    }

    if (obj.empty()) {
        // we passed the line check and we have no obj to check
        return true;
    }

    // TODO: allow speficy namespaces, not only global/non-global
    bool isvar = obj[0] == '&';
    std::string objname;
    if (isvar) {
        objname = obj.substr(1);
    } else {
        objname = obj;
    }

    bool isglobal = objname[0] == '@';
    if (isglobal) {
        objname = obj.substr(1);
    }

    auto len = objname.length();
    bool isfunc = len > 2 && objname.compare(len - 2, 2, "()") == 0;
    if (isfunc) {
        objname = objname.substr(0, len - 2);
    }

    if (isvar && isfunc) {
        static std::set<std::string> reported;
        if (reported.insert(obj).second) {
            llvm::errs() << "ERROR: ignoring invalid criterion (var and func "
                            "at the same time: "
                         << obj << "\n";
        }
        return false;
    }

    // obj match?
    if (!isvar && instIsCallOf(I, objname, pta)) {
        return true;
    } // else fall through to check the vars

    if (!isfunc && usesTheVariable(I, objname, isglobal, pta)) {
        return true;
    }

    return false;
}